

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O1

optional<cmList> *
anon_unknown.dwarf_816ce2::GetList
          (optional<cmList> *__return_storage_ptr__,string *var,cmMakefile *makefile)

{
  long *plVar1;
  undefined8 uVar2;
  PolicyStatus PVar3;
  cmValue cVar4;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var5;
  PolicyID id;
  PolicyID id_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  optional<cmList> list;
  string listString;
  string warn;
  _Storage<cmList,_false> local_118;
  char local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  char *local_70;
  undefined8 local_68;
  size_type local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  undefined8 local_50;
  undefined8 local_48;
  char *local_40;
  undefined8 local_38;
  
  local_100 = '\0';
  local_f0._M_string_length = 0;
  local_f0.field_2._M_local_buf[0] = '\0';
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  cVar4 = cmMakefile::GetDefinition(makefile,var);
  if ((cVar4.Value == (string *)0x0) ||
     (std::__cxx11::string::_M_assign((string *)&local_f0), cVar4.Value == (string *)0x0))
  goto switchD_0026da8a_caseD_2;
  if (local_f0._M_string_length == 0) {
    if (local_100 == '\x01') {
      local_100 = 0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_118._M_value.Values);
    }
    local_100 = '\x01';
    (__return_storage_ptr__->super__Optional_base<cmList,_false,_false>)._M_payload.
    super__Optional_payload<cmList,_true,_false,_false>.super__Optional_payload_base<cmList>.
    _M_engaged = false;
    *(undefined8 *)
     &(__return_storage_ptr__->super__Optional_base<cmList,_false,_false>)._M_payload.
      super__Optional_payload<cmList,_true,_false,_false>.super__Optional_payload_base<cmList>.
      _M_payload._M_value.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         = 0;
    *(pointer *)
     ((long)&(__return_storage_ptr__->super__Optional_base<cmList,_false,_false>)._M_payload.
             super__Optional_payload<cmList,_true,_false,_false>.
             super__Optional_payload_base<cmList>._M_payload._M_value.Values.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     + 8) = (pointer)0x0;
    *(pointer *)
     ((long)&(__return_storage_ptr__->super__Optional_base<cmList,_false,_false>)._M_payload.
             super__Optional_payload<cmList,_true,_false,_false>.
             super__Optional_payload_base<cmList>._M_payload._M_value.Values.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     + 0x10) = (pointer)0x0;
    local_118._M_value.Values.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_118._M_value.Values.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_118._M_value.Values.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    (__return_storage_ptr__->super__Optional_base<cmList,_false,_false>)._M_payload.
    super__Optional_payload<cmList,_true,_false,_false>.super__Optional_payload_base<cmList>.
    _M_engaged = true;
    goto LAB_0026dd16;
  }
  local_90._M_dataplus._M_p._0_4_ = 1;
  std::optional<cmList>::emplace<std::__cxx11::string&,cmList::EmptyElements>
            ((optional<cmList> *)&local_118._M_value,&local_f0,(EmptyElements *)&local_90);
  paVar6 = &local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_allocated_capacity =
       local_90.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_90._M_dataplus._M_p = (pointer)paVar6;
  _Var5 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    (local_118._M_value.Values.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_118._M_value.Values.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_90);
  uVar2 = local_118._M_value.Values.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar6) {
    operator_delete(local_90._M_dataplus._M_p,(ulong)(local_90.field_2._M_allocated_capacity + 1));
  }
  if (_Var5._M_current == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar2
     ) goto switchD_0026da8a_caseD_2;
  PVar3 = cmMakefile::GetPolicyStatus(makefile,CMP0007,false);
  uVar2 = local_118._M_value.Values.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  switch(PVar3) {
  case OLD:
    if (local_118._M_value.Values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_118._M_value.Values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      paVar6 = &(local_118._M_value.Values.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->field_2;
      do {
        plVar1 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (paVar6 + -1))->_M_dataplus)._M_p;
        if (paVar6 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)plVar1) {
          operator_delete(plVar1,paVar6->_M_allocated_capacity + 1);
        }
        pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(paVar6 + 1);
        paVar6 = paVar6 + 2;
      } while (pbVar7 != local_118._M_value.Values.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
      local_118._M_value.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)uVar2;
    }
    cmList::Insert(&local_118._M_value.Values,
                   (const_iterator)
                   local_118._M_value.Values.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,&local_f0,Yes,No);
  default:
switchD_0026da8a_caseD_2:
    (__return_storage_ptr__->super__Optional_base<cmList,_false,_false>)._M_payload.
    super__Optional_payload<cmList,_true,_false,_false>.super__Optional_payload_base<cmList>.
    _M_engaged = false;
    if (local_100 == '\x01') {
      *(pointer *)
       &(__return_storage_ptr__->super__Optional_base<cmList,_false,_false>)._M_payload.
        super__Optional_payload<cmList,_true,_false,_false>.super__Optional_payload_base<cmList>.
        _M_payload._M_value.Values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           = local_118._M_value.Values.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      *(pointer *)
       ((long)&(__return_storage_ptr__->super__Optional_base<cmList,_false,_false>)._M_payload.
               super__Optional_payload<cmList,_true,_false,_false>.
               super__Optional_payload_base<cmList>._M_payload._M_value.Values.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       + 8) = local_118._M_value.Values.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
      *(pointer *)
       ((long)&(__return_storage_ptr__->super__Optional_base<cmList,_false,_false>)._M_payload.
               super__Optional_payload<cmList,_true,_false,_false>.
               super__Optional_payload_base<cmList>._M_payload._M_value.Values.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       + 0x10) = local_118._M_value.Values.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_118._M_value.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_118._M_value.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_118._M_value.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->super__Optional_base<cmList,_false,_false>)._M_payload.
      super__Optional_payload<cmList,_true,_false,_false>.super__Optional_payload_base<cmList>.
      _M_engaged = true;
    }
    break;
  case WARN:
    if (local_118._M_value.Values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_118._M_value.Values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      paVar6 = &(local_118._M_value.Values.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->field_2;
      do {
        plVar1 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (paVar6 + -1))->_M_dataplus)._M_p;
        if (paVar6 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)plVar1) {
          operator_delete(plVar1,paVar6->_M_allocated_capacity + 1);
        }
        pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(paVar6 + 1);
        paVar6 = paVar6 + 2;
      } while (pbVar7 != local_118._M_value.Values.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
      local_118._M_value.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)uVar2;
    }
    cmList::Insert(&local_118._M_value.Values,
                   (const_iterator)
                   local_118._M_value.Values.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,&local_f0,Yes,No);
    cmPolicies::GetPolicyWarning_abi_cxx11_(&local_d0,(cmPolicies *)0x7,id_00);
    local_90._M_dataplus._M_p = (pointer)local_d0._M_string_length;
    local_90._M_string_length = (size_type)local_d0._M_dataplus._M_p;
    local_90.field_2._8_8_ = 0x13;
    local_70 = " List has value = [";
    local_68 = 0;
    local_60 = local_f0._M_string_length;
    local_58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_f0._M_dataplus._M_p;
    local_50 = 0;
    local_48 = 2;
    local_40 = "].";
    local_38 = 0;
    views._M_len = 4;
    views._M_array = (iterator)&local_90;
    local_90.field_2._M_allocated_capacity = (size_type)&local_d0;
    cmCatViews(&local_b0,views);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    cmMakefile::IssueMessage(makefile,AUTHOR_WARNING,&local_b0);
    (__return_storage_ptr__->super__Optional_base<cmList,_false,_false>)._M_payload.
    super__Optional_payload<cmList,_true,_false,_false>.super__Optional_payload_base<cmList>.
    _M_engaged = false;
    if (local_100 == '\x01') {
      *(pointer *)
       &(__return_storage_ptr__->super__Optional_base<cmList,_false,_false>)._M_payload.
        super__Optional_payload<cmList,_true,_false,_false>.super__Optional_payload_base<cmList>.
        _M_payload._M_value.Values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           = local_118._M_value.Values.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      *(pointer *)
       ((long)&(__return_storage_ptr__->super__Optional_base<cmList,_false,_false>)._M_payload.
               super__Optional_payload<cmList,_true,_false,_false>.
               super__Optional_payload_base<cmList>._M_payload._M_value.Values.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       + 8) = local_118._M_value.Values.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
      *(pointer *)
       ((long)&(__return_storage_ptr__->super__Optional_base<cmList,_false,_false>)._M_payload.
               super__Optional_payload<cmList,_true,_false,_false>.
               super__Optional_payload_base<cmList>._M_payload._M_value.Values.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       + 0x10) = local_118._M_value.Values.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_118._M_value.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_118._M_value.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_118._M_value.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->super__Optional_base<cmList,_false,_false>)._M_payload.
      super__Optional_payload<cmList,_true,_false,_false>.super__Optional_payload_base<cmList>.
      _M_engaged = true;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    break;
  case REQUIRED_IF_USED:
  case REQUIRED_ALWAYS:
    cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_90,(cmPolicies *)0x7,id);
    cmMakefile::IssueMessage(makefile,FATAL_ERROR,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar6) {
      operator_delete(local_90._M_dataplus._M_p,(ulong)(local_90.field_2._M_allocated_capacity + 1))
      ;
    }
    (__return_storage_ptr__->super__Optional_base<cmList,_false,_false>)._M_payload.
    super__Optional_payload<cmList,_true,_false,_false>.super__Optional_payload_base<cmList>.
    _M_engaged = false;
  }
LAB_0026dd16:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,
                    CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                             local_f0.field_2._M_local_buf[0]) + 1);
  }
  if (local_100 == '\x01') {
    local_100 = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_118._M_value.Values);
  }
  return __return_storage_ptr__;
}

Assistant:

cm::optional<cmList> GetList(const std::string& var,
                             const cmMakefile& makefile)
{
  cm::optional<cmList> list;

  std::string listString;
  if (!GetListString(listString, var, makefile)) {
    return list;
  }
  // if the size of the list
  if (listString.empty()) {
    list.emplace();
    return list;
  }
  // expand the variable into a list
  list.emplace(listString, cmList::EmptyElements::Yes);
  // if no empty elements then just return
  if (!cm::contains(*list, std::string())) {
    return list;
  }
  // if we have empty elements we need to check policy CMP0007
  switch (makefile.GetPolicyStatus(cmPolicies::CMP0007)) {
    case cmPolicies::WARN: {
      // Default is to warn and use old behavior
      // OLD behavior is to allow compatibility, so recall
      // ExpandListArgument without the true which will remove
      // empty values
      list->assign(listString);
      std::string warn =
        cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0007),
                 " List has value = [", listString, "].");
      makefile.IssueMessage(MessageType::AUTHOR_WARNING, warn);
      return list;
    }
    case cmPolicies::OLD:
      // OLD behavior is to allow compatibility, so recall
      // ExpandListArgument without the true which will remove
      // empty values
      list->assign(listString);
      return list;
    case cmPolicies::NEW:
      return list;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
      makefile.IssueMessage(
        MessageType::FATAL_ERROR,
        cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0007));
      return {};
  }
  return list;
}